

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_fspic.cpp
# Opt level: O0

void __thiscall FHudPic::Serialize(FHudPic *this,FArchive *arc)

{
  FArchive *pFVar1;
  FArchive *arc_local;
  FHudPic *this_local;
  
  pFVar1 = FArchive::operator<<(arc,&this->xpos);
  pFVar1 = FArchive::operator<<(pFVar1,&this->ypos);
  pFVar1 = FArchive::operator<<(pFVar1,&this->draw);
  ::operator<<(pFVar1,&this->texturenum);
  return;
}

Assistant:

void Serialize(FArchive & arc)
	{
		arc << xpos << ypos << draw << texturenum;
	}